

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsanchorlayout_p.cpp
# Opt level: O0

void __thiscall
QtGraphicsAnchorLayout::SequentialAnchorData::calculateSizeHints(SequentialAnchorData *this)

{
  AnchorData *pAVar1;
  bool bVar2;
  const_iterator o;
  AnchorData **ppAVar3;
  QList<QtGraphicsAnchorLayout::AnchorData_*> *in_RDI;
  long in_FS_OFFSET;
  bool edgeIsForward;
  AnchorData *edge;
  QList<QtGraphicsAnchorLayout::AnchorData_*> *__range1;
  AnchorVertex *prev;
  const_iterator __end1;
  const_iterator __begin1;
  AnchorVertex *local_30;
  const_iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  in_RDI[1].d.size = 0;
  in_RDI[2].d.d = (Data *)0x0;
  in_RDI[2].d.ptr = (AnchorData **)0x0;
  in_RDI[2].d.size = 0;
  in_RDI[3].d.d = (Data *)0x0;
  local_30 = (AnchorVertex *)in_RDI[1].d.d;
  local_10.i = (AnchorData **)&DAT_aaaaaaaaaaaaaaaa;
  local_10 = QList<QtGraphicsAnchorLayout::AnchorData_*>::begin(in_RDI);
  o = QList<QtGraphicsAnchorLayout::AnchorData_*>::end(in_RDI);
  while( true ) {
    bVar2 = QList<QtGraphicsAnchorLayout::AnchorData_*>::const_iterator::operator!=(&local_10,o);
    if (!bVar2) break;
    ppAVar3 = QList<QtGraphicsAnchorLayout::AnchorData_*>::const_iterator::operator*(&local_10);
    pAVar1 = *ppAVar3;
    if (pAVar1->from == local_30) {
      in_RDI[1].d.size = (qsizetype)(pAVar1->minSize + (double)in_RDI[1].d.size);
      in_RDI[2].d.d = (Data *)(pAVar1->prefSize + (double)in_RDI[2].d.d);
      in_RDI[2].d.ptr = (AnchorData **)(pAVar1->maxSize + (double)in_RDI[2].d.ptr);
      in_RDI[2].d.size = (qsizetype)(pAVar1->minPrefSize + (double)in_RDI[2].d.size);
      in_RDI[3].d.d = (Data *)(pAVar1->maxPrefSize + (double)in_RDI[3].d.d);
      local_30 = pAVar1->to;
    }
    else {
      in_RDI[1].d.size = (qsizetype)((double)in_RDI[1].d.size - pAVar1->maxSize);
      in_RDI[2].d.d = (Data *)((double)in_RDI[2].d.d - pAVar1->prefSize);
      in_RDI[2].d.ptr = (AnchorData **)((double)in_RDI[2].d.ptr - pAVar1->minSize);
      in_RDI[2].d.size = (qsizetype)((double)in_RDI[2].d.size - pAVar1->maxPrefSize);
      in_RDI[3].d.d = (Data *)((double)in_RDI[3].d.d - pAVar1->minPrefSize);
      local_30 = pAVar1->from;
    }
    QList<QtGraphicsAnchorLayout::AnchorData_*>::const_iterator::operator++(&local_10);
  }
  in_RDI[3].d.ptr = (AnchorData **)in_RDI[2].d.d;
  in_RDI[3].d.size = (qsizetype)in_RDI[2].d.d;
  in_RDI[4].d.d = in_RDI[2].d.d;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void SequentialAnchorData::calculateSizeHints()
{
    minSize = 0;
    prefSize = 0;
    maxSize = 0;
    minPrefSize = 0;
    maxPrefSize = 0;

    AnchorVertex *prev = from;

    for (AnchorData *edge : m_edges) {
        const bool edgeIsForward = (edge->from == prev);
        if (edgeIsForward) {
            minSize += edge->minSize;
            prefSize += edge->prefSize;
            maxSize += edge->maxSize;
            minPrefSize += edge->minPrefSize;
            maxPrefSize += edge->maxPrefSize;
            prev = edge->to;
        } else {
            Q_ASSERT(prev == edge->to);
            minSize -= edge->maxSize;
            prefSize -= edge->prefSize;
            maxSize -= edge->minSize;
            minPrefSize -= edge->maxPrefSize;
            maxPrefSize -= edge->minPrefSize;
            prev = edge->from;
        }
    }

    // See comment in AnchorData::refreshSizeHints() about sizeAt* values
    sizeAtMinimum = prefSize;
    sizeAtPreferred = prefSize;
    sizeAtMaximum = prefSize;
}